

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.cpp
# Opt level: O3

int __thiscall NULLCMemory::read_int(NULLCMemory *this,NULLCArray buffer,int offset)

{
  uint uVar1;
  uint uVar2;
  char *pcVar3;
  char *error;
  
  uVar1 = buffer.len;
  pcVar3 = buffer.ptr;
  if (this == (NULLCMemory *)0x0) {
    error = "buffer is empty";
  }
  else if ((int)uVar1 < 0) {
    error = "offset is negative";
  }
  else {
    uVar2 = (uint)buffer.ptr - uVar1;
    pcVar3 = (char *)(ulong)uVar2;
    offset = CONCAT31((int3)((uint)offset >> 8),3 < uVar2);
    if ((uVar1 <= (uint)buffer.ptr && uVar2 != 0) && 3 < uVar2) {
      return *(int *)(this + uVar1);
    }
    error = "buffer overflow";
  }
  nullcThrowError(error,pcVar3,uVar1,offset);
  return 0;
}

Assistant:

bool check_access(NULLCArray buffer, int offset, unsigned readSizeLog2, int elements)
	{
		if(!buffer.ptr)
		{
			nullcThrowError("buffer is empty");
			return false;
		}

		if(offset < 0)
		{
			nullcThrowError("offset is negative");
			return false;
		}

		if(elements < 0)
		{
			nullcThrowError("element count is negative");
			return false;
		}

		if(unsigned(offset) >= buffer.len)
		{
			nullcThrowError("buffer overflow");
			return false;
		}

		unsigned availableElements = ((buffer.len - offset) >> readSizeLog2);

		if(unsigned(elements) > availableElements)
		{
			nullcThrowError("buffer overflow");
			return false;
		}